

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaAttributeGroupPtr_conflict
xmlSchemaAddAttributeGroupDefinition
          (xmlSchemaParserCtxtPtr pctxt,xmlSchemaPtr schema,xmlChar *name,xmlChar *nsName,
          xmlNodePtr node)

{
  int iVar1;
  xmlSchemaRedefPtr_conflict pxVar2;
  xmlSchemaParserCtxtPtr local_40;
  xmlSchemaAttributeGroupPtr_conflict ret;
  xmlNodePtr node_local;
  xmlChar *nsName_local;
  xmlChar *name_local;
  xmlSchemaPtr schema_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  if ((pctxt == (xmlSchemaParserCtxtPtr)0x0) || (name == (xmlChar *)0x0)) {
    pctxt_local = (xmlSchemaParserCtxtPtr)0x0;
  }
  else {
    local_40 = (xmlSchemaParserCtxtPtr)(*xmlMalloc)(0x78);
    if (local_40 == (xmlSchemaParserCtxtPtr)0x0) {
      xmlSchemaPErrMemory(pctxt);
      pctxt_local = (xmlSchemaParserCtxtPtr)0x0;
    }
    else {
      memset(local_40,0,0x78);
      local_40->type = 0x10;
      local_40->error = (xmlSchemaValidityErrorFunc)name;
      local_40->buffer = (char *)nsName;
      local_40->schema = (xmlSchemaPtr)node;
      local_40->counter = local_40->counter | 2;
      if (pctxt->isRedefine != 0) {
        pxVar2 = xmlSchemaAddRedef(pctxt,pctxt->redefined,local_40,name,nsName);
        pctxt->redef = pxVar2;
        if (pctxt->redef == (xmlSchemaRedefPtr_conflict)0x0) {
          (*xmlFree)(local_40);
          return (xmlSchemaAttributeGroupPtr_conflict)0x0;
        }
        pctxt->redefCounter = 0;
      }
      if ((local_40 != (xmlSchemaParserCtxtPtr)0x0) &&
         (iVar1 = xmlSchemaAddItemSize(&pctxt->constructor->bucket->globals,5,local_40), iVar1 < 0))
      {
        xmlSchemaPErrMemory(pctxt);
        (*xmlFree)(local_40);
        local_40 = (xmlSchemaParserCtxtPtr)0x0;
      }
      if ((local_40 != (xmlSchemaParserCtxtPtr)0x0) &&
         (iVar1 = xmlSchemaAddItemSize(&pctxt->constructor->pending,10,local_40), iVar1 < 0)) {
        xmlSchemaPErrMemory(pctxt);
      }
      pctxt_local = local_40;
    }
  }
  return (xmlSchemaAttributeGroupPtr_conflict)pctxt_local;
}

Assistant:

static xmlSchemaAttributeGroupPtr
xmlSchemaAddAttributeGroupDefinition(xmlSchemaParserCtxtPtr pctxt,
                           xmlSchemaPtr schema ATTRIBUTE_UNUSED,
			   const xmlChar *name,
			   const xmlChar *nsName,
			   xmlNodePtr node)
{
    xmlSchemaAttributeGroupPtr ret = NULL;

    if ((pctxt == NULL) || (name == NULL))
        return (NULL);

    ret = (xmlSchemaAttributeGroupPtr)
        xmlMalloc(sizeof(xmlSchemaAttributeGroup));
    if (ret == NULL) {
	xmlSchemaPErrMemory(pctxt);
	return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaAttributeGroup));
    ret->type = XML_SCHEMA_TYPE_ATTRIBUTEGROUP;
    ret->name = name;
    ret->targetNamespace = nsName;
    ret->node = node;

    /* TODO: Remove the flag. */
    ret->flags |= XML_SCHEMAS_ATTRGROUP_GLOBAL;
    if (pctxt->isRedefine) {
	pctxt->redef = xmlSchemaAddRedef(pctxt, pctxt->redefined,
	    ret, name, nsName);
	if (pctxt->redef == NULL) {
	    xmlFree(ret);
	    return(NULL);
	}
	pctxt->redefCounter = 0;
    }
    WXS_ADD_GLOBAL(pctxt, ret);
    WXS_ADD_PENDING(pctxt, ret);
    return (ret);
}